

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Float __thiscall pbrt::PMJ02BNSampler::Get1D(PMJ02BNSampler *this)

{
  int iVar1;
  uint64_t uVar2;
  float fVar3;
  undefined1 auVar4 [16];
  
  uVar2 = MixBits((long)this->seed ^ (long)this->dimension << 0x10 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                  (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30);
  iVar1 = PermutationElement(this->sampleIndex,this->samplesPerPixel,(uint32_t)uVar2);
  fVar3 = BlueNoise(this->dimension,(Point2i)(this->pixel).super_Tuple2<pbrt::Point2,_int>);
  this->dimension = this->dimension + 1;
  auVar4._0_4_ = (fVar3 + (float)iVar1) / (float)this->samplesPerPixel;
  auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar4);
  return auVar4._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Get1D() {
        // Find permuted sample index for 1D PMJ02BNSampler sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        Float delta = BlueNoise(dimension, pixel);
        ++dimension;
        return std::min((index + delta) / samplesPerPixel, OneMinusEpsilon);
    }